

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  char *pcVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiWindowSettings *pIVar3;
  
  pcVar1 = (GImGui->SettingsWindows).Buf.Data;
  if (pcVar1 != (char *)0x0) {
    pIVar3 = (ImGuiWindowSettings *)(pcVar1 + 4);
    pIVar2 = pIVar3;
    do {
      if (pIVar2->ID == id) {
        return pIVar2;
      }
      pIVar2 = (ImGuiWindowSettings *)((long)&pIVar2->ID + (long)*(int *)&pIVar2[-1].Collapsed);
    } while (pIVar2 != (ImGuiWindowSettings *)
                       ((long)&pIVar3->ID + (long)(GImGui->SettingsWindows).Buf.Size));
  }
  return (ImGuiWindowSettings *)0x0;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}